

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall CDBIterator::GetValue<Coin>(CDBIterator *this,Coin *value)

{
  uint uVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *key;
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssValue;
  DataStream DStack_48;
  Wrapper<ScriptCompression,_CScript_&> local_28;
  Wrapper<AmountCompression,_long_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetValueImpl(this);
  DataStream::DataStream(&DStack_48,sp);
  key = dbwrapper_private::GetObfuscateKey(this->parent);
  DataStream::Xor(&DStack_48,key);
  uVar1 = ReadVarInt<DataStream,(VarIntMode)0,unsigned_int>(&DStack_48);
  *(uint *)&value->field_0x28 = uVar1;
  local_28.m_object = &(value->out).scriptPubKey;
  local_20.m_object = (long *)value;
  ActionUnserialize::
  SerReadWriteMany<DataStream,Wrapper<AmountCompression,long&>,Wrapper<ScriptCompression,CScript&>>
            (&DStack_48,&local_20,&local_28);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&DStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetValue(V& value) {
        try {
            DataStream ssValue{GetValueImpl()};
            ssValue.Xor(dbwrapper_private::GetObfuscateKey(parent));
            ssValue >> value;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }